

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
calcOrientationHist(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Mat *image,
                   Point2f *tmp,Point2f *center,double *angle)

{
  double *pdVar1;
  float fVar2;
  undefined8 uVar3;
  uchar *puVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  pointer pdVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  undefined8 local_178;
  int local_170 [2];
  Mat *local_168;
  undefined8 local_160;
  int local_158 [2];
  Mat *local_150;
  undefined8 local_148;
  undefined4 local_140 [2];
  Mat *local_138;
  undefined8 local_130;
  double local_128;
  Point2f local_118;
  Scalar_<double> local_110;
  Mat rot_mat;
  Mat tmp_image;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,8,(allocator_type *)&rot_mat);
  local_118 = *tmp;
  cv::getRotationMatrix2D(&rot_mat,&local_118,*angle,1.0);
  cv::Mat::Mat(&tmp_image);
  local_148 = 0;
  local_158[0] = 0x1010000;
  local_160 = 0;
  local_130 = 0;
  local_170[0] = 0x2010000;
  local_140[0] = 0x1010000;
  uVar3 = *(undefined8 *)(image->size).p;
  local_178 = CONCAT44((int)uVar3,(int)((ulong)uVar3 >> 0x20));
  local_168 = &tmp_image;
  local_150 = image;
  local_138 = &rot_mat;
  cv::Scalar_<double>::Scalar_(&local_110);
  cv::warpAffine(local_158,local_170,local_140,&local_178,1,0,&local_110);
  fVar2 = tmp->y;
  uVar10 = (ulong)fVar2;
  while( true ) {
    iVar8 = (int)uVar10;
    if (fVar2 + 4.0 <= (float)(uVar10 & 0xffffffff)) break;
    fVar2 = tmp->x;
    uVar7 = (ulong)fVar2;
    while( true ) {
      iVar6 = (int)uVar7;
      if (fVar2 + 4.0 <= (float)(uVar7 & 0xffffffff)) break;
      puVar4 = image->data;
      sVar5 = *(image->step).p;
      dVar14 = (double)puVar4[(long)(int)(iVar6 + 1U) + sVar5 * (long)iVar8] -
               (double)puVar4[(long)(iVar6 + -1) + sVar5 * (long)iVar8];
      dVar13 = (double)puVar4[(long)iVar6 + sVar5 * (long)(int)(iVar8 + 1U)] -
               (double)puVar4[(long)iVar6 + sVar5 * (long)(iVar8 + -1)];
      local_128 = calAngle(dVar14,dVar13);
      dVar13 = pow(dVar14 * dVar14 + dVar13 * dVar13,0.5);
      local_158[0] = (int)((float)(uVar7 & 0xffffffff) - center->x);
      local_170[0] = (int)((float)(uVar10 & 0xffffffff) - center->y);
      local_110.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 2.0;
      dVar14 = weight(local_158,local_170,(double *)&local_110);
      uVar9 = (uint)(local_128 / 45.0);
      if (uVar9 < 10) {
        dVar13 = dVar13 * dVar14;
        dVar14 = (local_128 - (double)(int)(uVar9 * 0x2d)) / 45.0 + -0.5;
        uVar7 = (ulong)uVar9;
        if (dVar14 <= 0.0) {
          dVar14 = ABS(dVar14);
          pdVar11 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar11[uVar7] = (1.0 - dVar14 * dVar13) + pdVar11[uVar7];
          if (uVar9 == 0) {
            pdVar11 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            pdVar11 = pdVar11 + uVar7;
          }
          pdVar12 = pdVar11 + -1;
        }
        else {
          pdVar12 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar1 = pdVar12 + uVar7 + 1;
          pdVar1[-1] = (1.0 - dVar14) * dVar13 + pdVar1[-1];
          if (uVar7 < ((long)(__return_storage_ptr__->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar12 >> 3) - 1U) {
            pdVar12 = pdVar1;
          }
        }
        *pdVar12 = dVar14 * dVar13 + *pdVar12;
      }
      fVar2 = tmp->x;
      uVar7 = (ulong)(iVar6 + 1U);
    }
    fVar2 = tmp->y;
    uVar10 = (ulong)(iVar8 + 1U);
  }
  Normalize(__return_storage_ptr__);
  cv::Mat::~Mat(&tmp_image);
  cv::Mat::~Mat(&rot_mat);
  return __return_storage_ptr__;
}

Assistant:

vector<double> calcOrientationHist(const Mat& image, const Point2f& tmp, const Point2f& center, const double& angle){
    vector<double> tmpBin(n_cell_bin);
    Mat rot_mat = getRotationMatrix2D(tmp, angle, 1.0);
    Mat tmp_image;
    warpAffine(image, tmp_image, rot_mat, image.size());
    // imshow("test", tmp_image);
    // waitKey(0);

    for(unsigned r = tmp.y; r < tmp.y+cell_width; r++){
        for(unsigned c = tmp.x; c < tmp.x+cell_width; c++){
            double neighborC, neighborR, neighborAngle, neighborParam, neighborMag;
            neighborC = (double)image.at<uchar>(r, c+1) - (double)image.at<uchar>(r, c-1);
            neighborR = (double)image.at<uchar>(r+1, c) - (double)image.at<uchar>(r-1, c);
            neighborAngle = calAngle(neighborC, neighborR);
            neighborMag = pow(neighborC * neighborC + neighborR * neighborR, 0.5);
            neighborMag *= weight(c-center.x, r-center.y, 0.5 * block_width);

            if( 0 <= int(neighborAngle/45) && int(neighborAngle/45) <= 9){
                int bin = neighborAngle/45;
                double proportion = (neighborAngle-bin*45)/45.0 - 0.5;
                // cout << bin << "    " << proportion << "    " << 1-proportion << endl;
                
                if(proportion > 0){
                    tmpBin[bin] += (1-proportion) * neighborMag;
                    if(bin < tmpBin.size()-1){
                        tmpBin[bin+1] += proportion * neighborMag;
                    }
                    else
                        tmpBin[0] += proportion * neighborMag;
                }
                else{
                    tmpBin[bin] += 1-abs(proportion) * neighborMag;
                    if(bin > 0)
                        tmpBin[bin-1] += abs(proportion) * neighborMag;
                    else
                        tmpBin[tmpBin.size()-1] += abs(proportion) * neighborMag;
                }
            }
        }
    }
    Normalize(tmpBin);
    // ReNormalize(tmpBin);
    return tmpBin;
}